

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

Expr to_lower(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
             int argc)

{
  _Bool _Var1;
  ValueType VVar2;
  int iVar3;
  pString value;
  Expr EVar5;
  Expr EVar6;
  Expr expr;
  Expr ptr;
  Expr expr_00;
  Expr expr_01;
  Expr expr_02;
  char res_char;
  pString res_str;
  Expr arg;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  
  hlp_check_args_count(argc,1,1,"to-lower");
  EVar5._4_4_ = 0;
  EVar5.type = args->type;
  EVar5.field_1.val_atom = (args->field_1).val_atom;
  EVar5 = exec_eval(exec,callContext,EVar5);
  aVar4 = EVar5.field_1;
  VVar2 = EVar5.type;
  expr._4_4_ = 0;
  expr.type = VVar2;
  expr.field_1.val_atom = aVar4.val_atom;
  _Var1 = is_string(expr);
  if (_Var1) {
    ptr._4_4_ = 0;
    ptr.type = VVar2;
    ptr.field_1.val_atom = aVar4.val_atom;
    EVar5 = dereference(ptr);
    value = string_to_lower(EVar5.field_1.val_str);
    if (value == (pString)0x0) {
      printf("to-lower: string_to_lower failed\n");
      exit(1);
    }
    EVar5 = make_string(exec,value);
    res._0_8_ = EVar5.field_1;
    exec_local._0_4_ = EVar5.type;
    free_string(value);
    expr_00._4_4_ = 0;
    expr_00.type = (ValueType)exec_local;
    expr_00.field_1.val_atom = res._0_8_;
    _Var1 = is_none(expr_00);
    if (_Var1) {
      printf("to-lower: make_string failed\n");
      exit(1);
    }
  }
  else {
    expr_01._4_4_ = 0;
    expr_01.type = VVar2;
    expr_01.field_1.val_atom = aVar4.val_atom;
    _Var1 = is_char(expr_01);
    if (!_Var1) {
      printf("to-lower: argument not a string or char\n");
      exit(1);
    }
    arg.type._0_1_ = EVar5.field_1._0_1_;
    iVar3 = tolower((int)(char)(undefined1)arg.type);
    EVar5 = make_char(exec,(char)iVar3);
    res._0_8_ = EVar5.field_1;
    exec_local._0_4_ = EVar5.type;
    expr_02._4_4_ = 0;
    expr_02.type = (ValueType)exec_local;
    expr_02.field_1.val_atom = res._0_8_;
    _Var1 = is_none(expr_02);
    if (_Var1) {
      printf("to-lower: make_char failed\n");
      exit(1);
    }
  }
  EVar6._4_4_ = 0;
  EVar6.type = (ValueType)exec_local;
  EVar6.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)res._0_8_;
  return EVar6;
}

Assistant:

BUILTIN_FUNC(to_lower)
{
    hlp_check_args_count(argc, 1, 1, "to-lower");
    Expr arg = EVAL_ARG(0);

    if (is_string(arg))
    {
        pString res_str = string_to_lower(dereference(arg).val_str);
        if (res_str == NULL)
        {
            log("to-lower: string_to_lower failed");
            exit(1);
        }
        Expr res = make_string(exec, res_str);
        free_string(res_str);
        if (is_none(res))
        {
            log("to-lower: make_string failed");
            exit(1);
        }
        return res;
    }
    else if (is_char(arg))
    {
        char res_char = (char) tolower(arg.val_char);
        Expr res = make_char(exec, res_char);
        if (is_none(res))
        {
            log("to-lower: make_char failed");
            exit(1);
        }
        return res;
    }
    else
    {
        log("to-lower: argument not a string or char");
        exit(1);
    }
}